

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StegerMatch.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Mat *this;
  bool bVar1;
  ostream *poVar2;
  _InputArray local_548;
  allocator<char> local_529;
  string local_528 [32];
  _InputArray local_508;
  allocator<char> local_4e9;
  string local_4e8 [32];
  _InputArray local_4c8;
  allocator<char> local_4a9;
  string local_4a8 [32];
  vector<int,_std::allocator<int>_> local_488;
  _InputArray local_468;
  allocator<char> local_449;
  string local_448 [32];
  _OutputArray local_428;
  Mat local_410 [3];
  undefined1 local_2b0 [8];
  Mat saving_image;
  Mat myOutput;
  StegerMatch match;
  string local_1b0 [32];
  undefined1 local_190 [8];
  Mat myInput;
  Point_<int> local_128;
  Rect_<int> local_120;
  Mat local_110;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  Mat myTemplate;
  char **argv_local;
  int argc_local;
  
  myTemplate.step.buf[1] = (size_t)argv;
  poVar2 = std::operator<<((ostream *)&std::cout,"Hello Steger2002 matcher!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"C:/Users/hisham/stegerMatch/template.jpg",&local_99);
  cv::imread((string *)local_78,(int)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  cv::Point_<int>::Point_(&local_128,300,0x96);
  cv::Size_<int>::Size_((Size_<int> *)(myInput.step.buf + 1),0x15e,200);
  cv::Rect_<int>::Rect_(&local_120,&local_128,(Size_<int> *)(myInput.step.buf + 1));
  cv::Mat::operator()(&local_110,(Mat *)local_78,&local_120);
  cv::Mat::operator=((Mat *)local_78,&local_110);
  cv::Mat::~Mat(&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"C:/Users/hisham/stegerMatch/input.jpg",
             (allocator<char> *)
             ((long)&match.mTemplateSet.
                     super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cv::imread((string *)local_190,(int)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&match.mTemplateSet.
                     super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  StegerMatch::StegerMatch((StegerMatch *)(myOutput.step.buf + 1));
  StegerMatch::loadTemplate((StegerMatch *)(myOutput.step.buf + 1),(Mat *)local_78);
  bVar1 = StegerMatch::isTemplateLoaded((StegerMatch *)(myOutput.step.buf + 1));
  if (bVar1) {
    this = (Mat *)(saving_image.step.buf + 1);
    cv::Mat::Mat(this);
    StegerMatch::processFrame((StegerMatch *)(myOutput.step.buf + 1),(Mat *)local_190,this);
    cv::operator*(local_410,256.0);
    cv::MatExpr::operator_cast_to_Mat((Mat *)local_2b0,(MatExpr *)local_410);
    cv::MatExpr::~MatExpr((MatExpr *)local_410);
    cv::_OutputArray::_OutputArray(&local_428,(Mat *)local_2b0);
    cv::Mat::convertTo((_OutputArray *)local_2b0,(int)&local_428,1.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_428);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_448,"output.jpg",&local_449);
    cv::_InputArray::_InputArray(&local_468,(Mat *)local_2b0);
    local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_488);
    cv::imwrite(local_448,&local_468,(vector *)&local_488);
    std::vector<int,_std::allocator<int>_>::~vector(&local_488);
    cv::_InputArray::~_InputArray(&local_468);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator(&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4a8,"template",&local_4a9);
    cv::_InputArray::_InputArray(&local_4c8,(Mat *)local_78);
    cv::imshow(local_4a8,&local_4c8);
    cv::_InputArray::~_InputArray(&local_4c8);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4e8,"input",&local_4e9);
    cv::_InputArray::_InputArray(&local_508,(Mat *)local_190);
    cv::imshow(local_4e8,&local_508);
    cv::_InputArray::~_InputArray(&local_508);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_528,"output",&local_529);
    cv::_InputArray::_InputArray(&local_548,(Mat *)(saving_image.step.buf + 1));
    cv::imshow(local_528,&local_548);
    cv::_InputArray::~_InputArray(&local_548);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator(&local_529);
    cv::waitKey(0);
    cv::Mat::~Mat((Mat *)local_2b0);
    cv::Mat::~Mat((Mat *)(saving_image.step.buf + 1));
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Template was not loaded.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  StegerMatch::~StegerMatch((StegerMatch *)(myOutput.step.buf + 1));
  cv::Mat::~Mat((Mat *)local_190);
  cv::Mat::~Mat((Mat *)local_78);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    cout << "Hello Steger2002 matcher!" << endl;
    
    Mat myTemplate = imread("C:/Users/hisham/stegerMatch/template.jpg");
    //create ROI on the template image to only include the object... fill in the right values
	myTemplate = myTemplate(Rect(Point(300, 150), Size(350, 200)));
    
    Mat myInput = imread("C:/Users/hisham/stegerMatch/input.jpg");
	//Mat myInput = imread("C:/Users/hisham/stegerMatch/template2.jpg");
    


    StegerMatch match;	
    match.loadTemplate(myTemplate);
	
    if (match.isTemplateLoaded()) {
        Mat myOutput;
        match.processFrame(myInput, myOutput);
        
		Mat saving_image=myOutput*256;
		saving_image.convertTo(saving_image, CV_8UC1);
		imwrite("output.jpg", saving_image);


        imshow("template",  myTemplate);
        imshow("input",     myInput);
        imshow("output",    myOutput);
        waitKey(0);
    } else {
        cerr << "Template was not loaded." << endl;
    }
	
	
    
    return 0;
}